

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O1

half Imf_2_5::uintToHalf(uint ui)

{
  short sVar1;
  unsigned_short uVar2;
  float fVar3;
  
  uVar2 = 0x7c00;
  if (ui < 0xffe1) {
    fVar3 = (float)ui;
    if (ui == 0) {
      return (half)(unsigned_short)((uint)fVar3 >> 0x10);
    }
    sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar3 >> 0x17) * 2);
    if (sVar1 == 0) {
      uVar2 = half::convert((int)fVar3);
      return (half)uVar2;
    }
    uVar2 = sVar1 + (short)(((uint)fVar3 & 0x7fffff) + 0xfff + (uint)(((uint)fVar3 >> 0xd & 1) != 0)
                           >> 0xd);
  }
  return (half)uVar2;
}

Assistant:

half	
uintToHalf (unsigned int ui)
{
    if (ui >  HALF_MAX)
	return half::posInf();

    return half ((float) ui);
}